

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

UpdateWitnessStackRequestStruct * __thiscall
cfd::js::api::json::UpdateWitnessStackRequest::ConvertToStruct
          (UpdateWitnessStackRequestStruct *__return_storage_ptr__,UpdateWitnessStackRequest *this)

{
  UpdateWitnessStackTxInRequestStruct UStack_118;
  
  UpdateWitnessStackRequestStruct::UpdateWitnessStackRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->is_elements = this->is_elements_;
  UpdateWitnessStackTxInRequest::ConvertToStruct(&UStack_118,&this->txin_);
  UpdateWitnessStackTxInRequestStruct::operator=(&__return_storage_ptr__->txin,&UStack_118);
  UpdateWitnessStackTxInRequestStruct::~UpdateWitnessStackTxInRequestStruct(&UStack_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

UpdateWitnessStackRequestStruct UpdateWitnessStackRequest::ConvertToStruct() const {  // NOLINT
  UpdateWitnessStackRequestStruct result;
  result.tx = tx_;
  result.is_elements = is_elements_;
  result.txin = txin_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}